

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

void Curl_http2_done(Curl_easy *data,_Bool premature)

{
  HTTP *pHVar1;
  connectdata *pcVar2;
  int iVar3;
  anon_union_248_5_a113b5f6_for_proto *c;
  int rv;
  http_conn *httpc;
  HTTP *http;
  _Bool premature_local;
  Curl_easy *data_local;
  
  pHVar1 = (data->req).p.http;
  pcVar2 = data->conn;
  c = &pcVar2->proto;
  Curl_dyn_free(&pHVar1->header_recvbuf);
  Curl_dyn_free(&pHVar1->trailer_recvbuf);
  if (pHVar1->push_headers != (char **)0x0) {
    while (pHVar1->push_headers_used != 0) {
      (*Curl_cfree)(pHVar1->push_headers[pHVar1->push_headers_used - 1]);
      pHVar1->push_headers_used = pHVar1->push_headers_used - 1;
    }
    (*Curl_cfree)(pHVar1->push_headers);
    pHVar1->push_headers = (char **)0x0;
  }
  if (((data->conn->handler->protocol & 3) != 0) && ((pcVar2->proto).ftpc.pp.sendbuf.leng != 0)) {
    if (pHVar1->stream_id == (pcVar2->proto).httpc.pause_stream_id) {
      (pcVar2->proto).httpc.pause_stream_id = 0;
    }
    if ((premature) || (((pHVar1->closed & 1U) == 0 && (pHVar1->stream_id != 0)))) {
      set_transfer(&c->httpc,data);
      iVar3 = nghttp2_submit_rst_stream((pcVar2->proto).httpc.h2,'\0',pHVar1->stream_id,5);
      if (iVar3 == 0) {
        nghttp2_session_send((pcVar2->proto).httpc.h2);
      }
    }
    if ((data->state).drain != 0) {
      drained_transfer(data,&c->httpc);
    }
    if (0 < pHVar1->stream_id) {
      iVar3 = nghttp2_session_set_stream_user_data
                        ((pcVar2->proto).httpc.h2,pHVar1->stream_id,(void *)0x0);
      if (iVar3 != 0) {
        Curl_infof(data,"http/2: failed to clear user_data for stream %u",
                   (ulong)(uint)pHVar1->stream_id);
      }
      set_transfer(&c->httpc,(Curl_easy *)0x0);
      pHVar1->stream_id = 0;
    }
  }
  return;
}

Assistant:

void Curl_http2_done(struct Curl_easy *data, bool premature)
{
  struct HTTP *http = data->req.p.http;
  struct http_conn *httpc = &data->conn->proto.httpc;

  /* there might be allocated resources done before this got the 'h2' pointer
     setup */
  Curl_dyn_free(&http->header_recvbuf);
  Curl_dyn_free(&http->trailer_recvbuf);
  if(http->push_headers) {
    /* if they weren't used and then freed before */
    for(; http->push_headers_used > 0; --http->push_headers_used) {
      free(http->push_headers[http->push_headers_used - 1]);
    }
    free(http->push_headers);
    http->push_headers = NULL;
  }

  if(!(data->conn->handler->protocol&PROTO_FAMILY_HTTP) ||
     !httpc->h2) /* not HTTP/2 ? */
    return;

  /* do this before the reset handling, as that might clear ->stream_id */
  if(http->stream_id == httpc->pause_stream_id) {
    H2BUGF(infof(data, "DONE the pause stream (%u)", http->stream_id));
    httpc->pause_stream_id = 0;
  }
  if(premature || (!http->closed && http->stream_id)) {
    /* RST_STREAM */
    set_transfer(httpc, data); /* set the transfer */
    H2BUGF(infof(data, "RST stream %u", http->stream_id));
    if(!nghttp2_submit_rst_stream(httpc->h2, NGHTTP2_FLAG_NONE,
                                  http->stream_id, NGHTTP2_STREAM_CLOSED))
      (void)nghttp2_session_send(httpc->h2);
  }

  if(data->state.drain)
    drained_transfer(data, httpc);

  /* -1 means unassigned and 0 means cleared */
  if(http->stream_id > 0) {
    int rv = nghttp2_session_set_stream_user_data(httpc->h2,
                                                  http->stream_id, 0);
    if(rv) {
      infof(data, "http/2: failed to clear user_data for stream %u",
            http->stream_id);
      DEBUGASSERT(0);
    }
    set_transfer(httpc, NULL);
    http->stream_id = 0;
  }
}